

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall
cmDocumentation::GlobHelp
          (cmDocumentation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *pattern)

{
  bool bVar1;
  string *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string findExpr;
  Glob gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Glob local_68;
  
  cmsys::Glob::Glob(&local_68);
  __lhs = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&bStack_c8,__lhs,"/Help/");
  std::operator+(&local_a8,&bStack_c8,pattern);
  std::operator+(&local_88,&local_a8,".rst");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&bStack_c8);
  bVar1 = cmsys::Glob::FindFiles(&local_68,&local_88,(GlobMessages *)0x0);
  if (bVar1) {
    __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(files,__x);
  }
  std::__cxx11::string::~string((string *)&local_88);
  cmsys::Glob::~Glob(&local_68);
  return;
}

Assistant:

void cmDocumentation::GlobHelp(std::vector<std::string>& files,
                               std::string const& pattern)
{
  cmsys::Glob gl;
  std::string findExpr =
    cmSystemTools::GetCMakeRoot() + "/Help/" + pattern + ".rst";
  if (gl.FindFiles(findExpr)) {
    files = gl.GetFiles();
  }
}